

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O3

void __thiscall ImplSimd<SimdSSE2>::RGB2YUV(ImplSimd<SimdSSE2> *this,RGB *rgb,YUV420 *yuv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if (yuv->height_ != rgb->height_) {
    __assert_fail("yuv->height_ == rgb->height_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3d,
                  "virtual void ImplSimd<SimdSSE2>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdSSE2]");
  }
  if (yuv->width_ == rgb->width_) {
    if ((yuv->size_ & 7) == 0) {
      if (yuv->size_ != 0) {
        puVar3 = yuv->y_;
        puVar4 = yuv->u_;
        puVar5 = yuv->v_;
        puVar6 = rgb->r_;
        puVar7 = rgb->g_;
        puVar8 = rgb->b_;
        uVar12 = 0;
        auVar13._8_2_ = 0x42;
        auVar13._0_8_ = 0x42004200420042;
        auVar13._10_2_ = 0x42;
        auVar13._12_2_ = 0x42;
        auVar13._14_2_ = 0x42;
        auVar14._8_2_ = 0x19;
        auVar14._0_8_ = 0x19001900190019;
        auVar14._10_2_ = 0x19;
        auVar14._12_2_ = 0x19;
        auVar14._14_2_ = 0x19;
        auVar15._8_2_ = 0x80;
        auVar15._0_8_ = 0x80008000800080;
        auVar15._10_2_ = 0x80;
        auVar15._12_2_ = 0x80;
        auVar15._14_2_ = 0x80;
        auVar16._8_2_ = 0x10;
        auVar16._0_8_ = 0x10001000100010;
        auVar16._10_2_ = 0x10;
        auVar16._12_2_ = 0x10;
        auVar16._14_2_ = 0x10;
        auVar17._8_2_ = 0x70;
        auVar17._0_8_ = 0x70007000700070;
        auVar17._10_2_ = 0x70;
        auVar17._12_2_ = 0x70;
        auVar17._14_2_ = 0x70;
        auVar18._8_2_ = 0xffda;
        auVar18._0_8_ = 0xffdaffdaffdaffda;
        auVar18._10_2_ = 0xffda;
        auVar18._12_2_ = 0xffda;
        auVar18._14_2_ = 0xffda;
        auVar19._8_2_ = 0xffb6;
        auVar19._0_8_ = 0xffb6ffb6ffb6ffb6;
        auVar19._10_2_ = 0xffb6;
        auVar19._12_2_ = 0xffb6;
        auVar19._14_2_ = 0xffb6;
        auVar20._8_2_ = 0xffa2;
        auVar20._0_8_ = 0xffa2ffa2ffa2ffa2;
        auVar20._10_2_ = 0xffa2;
        auVar20._12_2_ = 0xffa2;
        auVar20._14_2_ = 0xffa2;
        auVar21._8_2_ = 0xffee;
        auVar21._0_8_ = 0xffeeffeeffeeffee;
        auVar21._10_2_ = 0xffee;
        auVar21._12_2_ = 0xffee;
        auVar21._14_2_ = 0xffee;
        do {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)(puVar6 + uVar12);
          auVar9 = vpmovzxbw_avx(auVar22);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(puVar7 + uVar12);
          auVar10 = vpmovzxbw_avx(auVar1);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(puVar8 + uVar12);
          auVar2 = vpmovzxbw_avx(auVar2);
          auVar1 = vpmullw_avx(auVar9,auVar13);
          auVar22 = vpsllw_avx(auVar10,7);
          auVar22 = vpaddw_avx(auVar10,auVar22);
          auVar22 = vpaddw_avx(auVar1,auVar22);
          auVar1 = vpmullw_avx(auVar2,auVar14);
          auVar1 = vpaddw_avx(auVar1,auVar15);
          auVar22 = vpaddw_avx(auVar22,auVar1);
          auVar22 = vpsraw_avx(auVar22,8);
          auVar22 = vpaddw_avx(auVar22,auVar16);
          auVar22 = vpacksswb_avx(auVar22,auVar22);
          *(long *)(puVar3 + uVar12) = auVar22._0_8_;
          auVar1 = vpmullw_avx(auVar2,auVar17);
          auVar22 = vpmullw_avx(auVar9,auVar18);
          auVar11 = vpmullw_avx(auVar10,auVar19);
          auVar22 = vpaddw_avx(auVar22,auVar11);
          auVar1 = vpaddw_avx(auVar1,auVar15);
          auVar22 = vpaddw_avx(auVar22,auVar1);
          auVar22 = vpsraw_avx(auVar22,8);
          auVar22 = vpaddw_avx(auVar22,auVar15);
          auVar22 = vpacksswb_avx(auVar22,auVar22);
          *(long *)(puVar4 + uVar12) = auVar22._0_8_;
          auVar22 = vpmullw_avx(auVar9,auVar17);
          auVar1 = vpmullw_avx(auVar10,auVar20);
          auVar22 = vpaddw_avx(auVar22,auVar1);
          auVar1 = vpmullw_avx(auVar2,auVar21);
          auVar1 = vpaddw_avx(auVar1,auVar15);
          auVar22 = vpaddw_avx(auVar22,auVar1);
          auVar22 = vpsraw_avx(auVar22,8);
          auVar22 = vpaddw_avx(auVar22,auVar15);
          auVar22 = vpacksswb_avx(auVar22,auVar22);
          *(long *)(puVar5 + uVar12) = auVar22._0_8_;
          uVar12 = uVar12 + 8;
        } while (uVar12 < yuv->size_);
      }
      return;
    }
    __assert_fail("yuv->size_ % kStride == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3f,
                  "virtual void ImplSimd<SimdSSE2>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdSSE2]");
  }
  __assert_fail("yuv->width_ == rgb->width_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x3e,"virtual void ImplSimd<SimdSSE2>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdSSE2]")
  ;
}

Assistant:

void ImplSimd<SIMD>::RGB2YUV(RGB *rgb, YUV420 *yuv) {
  assert(yuv->height_ == rgb->height_);
  assert(yuv->width_ == rgb->width_);
  assert(yuv->size_ % kStride == 0);

  auto y = yuv->y_;
  auto u = yuv->u_;
  auto v = yuv->v_;
  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  for(size_t i = 0; i < yuv->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);

    /*
    y[i] = clamp(((66 * c + 129 * d + 25 * e + 128) >> 8) + 16);
    u[i] = clamp(((-38 * c - 74 * d + 112 * e + 128) >> 8) + 128);
    v[i] = clamp(((112 * c - 94 * d - 18 * e + 128) >> 8) + 128);
     */
    store(add(rli(add(add(add(mul(cn(66),c), mul(cn(129), d)), mul(cn(25), e)), cn(128)),8), cn(16)), y+i);
    store(add(rli(add(sub(sub(mul(cn(112),e), mul(cn(38), c)), mul(cn(74), d)), cn(128)),8), cn(128)), u+i);
    store(add(rli(add(sub(sub(mul(cn(112),c), mul(cn(94), d)), mul(cn(18), e)), cn(128)),8), cn(128)), v+i);
    SIMD::Empty();
  }

}